

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long extraout_RDX;
  secp256k1_gej *psVar11;
  ulong uVar12;
  secp256k1_ge *x;
  secp256k1_gej *psVar13;
  secp256k1_ge *a_01;
  ulong uVar14;
  secp256k1_gej *unaff_R12;
  secp256k1_fe *psVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *unaff_R13;
  long lVar17;
  int *piVar18;
  long lVar19;
  bool bVar20;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_fe z22;
  secp256k1_ge_storage sStack_368;
  code *pcStack_328;
  secp256k1_gej *psStack_320;
  undefined1 auStack_318 [88];
  undefined8 uStack_2c0;
  secp256k1_gej *local_2b0;
  uint64_t local_2a8;
  ulong local_2a0;
  secp256k1_fe *local_298;
  secp256k1_gej *local_290;
  secp256k1_gej *local_288;
  secp256k1_gej *local_280;
  secp256k1_gej *local_278;
  secp256k1_gej *local_270;
  secp256k1_fe *local_268;
  secp256k1_fe *local_260;
  secp256k1_gej *local_258;
  secp256k1_gej *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  uint64_t local_1f8;
  int local_1f0;
  undefined1 local_1e8 [56];
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  int local_190;
  undefined1 local_188 [56];
  secp256k1_gej *local_150;
  secp256k1_gej *local_148;
  secp256k1_gej *local_140;
  ulong local_138;
  ulong local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  uint64_t local_98;
  uint64_t uStack_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  undefined8 local_70;
  secp256k1_fe local_60;
  
  uStack_2c0._0_4_ = 0x14cede;
  uStack_2c0._4_4_ = 0;
  psVar11 = a;
  secp256k1_gej_verify(a);
  uStack_2c0._0_4_ = 0x14cee6;
  uStack_2c0._4_4_ = 0;
  psVar13 = b;
  secp256k1_gej_verify(b);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      b = a;
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
        rzr->magnitude = 1;
        rzr->normalized = 1;
        uStack_2c0._0_4_ = 0x14cf3e;
        uStack_2c0._4_4_ = 0;
        secp256k1_fe_verify(rzr);
      }
      goto LAB_0014cf49;
    }
    psVar15 = &b->z;
    uStack_2c0._0_4_ = 0x14cf80;
    uStack_2c0._4_4_ = 0;
    local_2b0 = r;
    local_298 = rzr;
    secp256k1_fe_sqr(&local_60,psVar15);
    a_00 = &a->z;
    uStack_2c0._0_4_ = 0x14cf97;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_sqr(&local_c8,a_00);
    uStack_2c0._0_4_ = 0x14cfaa;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul(&local_128,&a->x,&local_60);
    uStack_2c0._0_4_ = 0x14cfbd;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)(local_1e8 + 0x30),&b->x,&local_c8);
    uStack_2c0._0_4_ = 0x14cfd9;
    uStack_2c0._4_4_ = 0;
    local_290 = a;
    secp256k1_fe_mul((secp256k1_fe *)local_1e8,&a->y,&local_60);
    uStack_2c0._0_4_ = 0x14cfec;
    uStack_2c0._4_4_ = 0;
    local_268 = psVar15;
    secp256k1_fe_mul((secp256k1_fe *)local_1e8,(secp256k1_fe *)local_1e8,psVar15);
    uStack_2c0._0_4_ = 0x14d00b;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul(&local_f8,&b->y,&local_c8);
    unaff_R13 = (secp256k1_gej *)0x3ffffbfffff0bc;
    uStack_2c0._0_4_ = 0x14d028;
    uStack_2c0._4_4_ = 0;
    local_260 = a_00;
    secp256k1_fe_mul(&local_f8,&local_f8,a_00);
    uStack_2c0._0_4_ = 0x14d038;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&local_128);
    psVar11 = (secp256k1_gej *)0x1;
    uStack_2c0._0_4_ = 0x14d045;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&local_128,1);
    r = (secp256k1_gej *)(0x3ffffbfffff0bc - local_128.n[0]);
    b = (secp256k1_gej *)(0x3ffffffffffffc - local_128.n[1]);
    a = (secp256k1_gej *)(0x3ffffffffffffc - local_128.n[2]);
    rzr = (secp256k1_fe *)(0x3ffffffffffffc - local_128.n[3]);
    local_2a0 = 0x3fffffffffffc - local_128.n[4];
    local_130 = 2;
    uStack_2c0._0_4_ = 0x14d0b1;
    uStack_2c0._4_4_ = 0;
    local_188._48_8_ = r;
    local_150 = b;
    local_148 = a;
    local_140 = (secp256k1_gej *)rzr;
    local_138 = local_2a0;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    uStack_2c0._0_4_ = 0x14d0b9;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    unaff_R12 = (secp256k1_gej *)(local_1e8 + 0x30);
    uStack_2c0._0_4_ = 0x14d0c9;
    uStack_2c0._4_4_ = 0;
    psVar13 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x1e < local_190) goto LAB_0014d795;
    local_258 = (secp256k1_gej *)((long)(r->x).n + local_1e8._48_8_);
    local_250 = (secp256k1_gej *)((long)(b->x).n + local_1b0);
    local_278 = (secp256k1_gej *)((long)(a->x).n + local_1a8);
    local_270 = (secp256k1_gej *)((long)(((secp256k1_gej *)rzr)->x).n + local_1a0);
    local_2a0 = local_2a0 + local_198;
    local_130 = (ulong)(local_190 + 2);
    uStack_2c0._0_4_ = 0x14d14a;
    uStack_2c0._4_4_ = 0;
    local_188._48_8_ = local_258;
    local_150 = local_250;
    local_148 = local_278;
    local_140 = local_270;
    local_138 = local_2a0;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    uStack_2c0._0_4_ = 0x14d15a;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&local_f8);
    psVar11 = (secp256k1_gej *)0x1;
    uStack_2c0._0_4_ = 0x14d167;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&local_f8,1);
    a = (secp256k1_gej *)(0x3ffffbfffff0bc - local_f8.n[0]);
    unaff_R13 = (secp256k1_gej *)local_188;
    rzr = (secp256k1_fe *)(0x3ffffffffffffc - local_f8.n[1]);
    r = (secp256k1_gej *)(0x3ffffffffffffc - local_f8.n[2]);
    local_2a8 = 0x3ffffffffffffc - local_f8.n[3];
    b = (secp256k1_gej *)(0x3fffffffffffc - local_f8.n[4]);
    local_188._40_8_ = 2;
    uStack_2c0._0_4_ = 0x14d1cd;
    uStack_2c0._4_4_ = 0;
    local_188._0_8_ = a;
    local_188._8_8_ = rzr;
    local_188._16_8_ = r;
    local_188._24_8_ = local_2a8;
    local_188._32_8_ = b;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    uStack_2c0._0_4_ = 0x14d1d5;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    unaff_R12 = (secp256k1_gej *)local_1e8;
    uStack_2c0._0_4_ = 0x14d1e5;
    uStack_2c0._4_4_ = 0;
    psVar13 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x1e < (int)local_1e8._40_4_) goto LAB_0014d79a;
    local_280 = (secp256k1_gej *)((long)(a->x).n + local_1e8._0_8_);
    psVar13 = (secp256k1_gej *)((long)(((secp256k1_gej *)rzr)->x).n + local_1e8._8_8_);
    psVar11 = (secp256k1_gej *)((long)(r->x).n + local_1e8._16_8_);
    local_2a8 = local_2a8 + local_1e8._24_8_;
    b = (secp256k1_gej *)((long)(b->x).n + local_1e8._32_8_);
    local_188._44_4_ = 0;
    local_188._40_4_ = local_1e8._40_4_ + 2;
    uStack_2c0._0_4_ = 0x14d273;
    uStack_2c0._4_4_ = 0;
    local_288 = b;
    local_188._0_8_ = local_280;
    local_188._8_8_ = psVar13;
    local_188._16_8_ = psVar11;
    local_188._24_8_ = local_2a8;
    local_188._32_8_ = b;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    uStack_2c0._0_4_ = 0x14d280;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    r = local_2b0;
    uVar8 = (local_2a0 >> 0x30) * 0x1000003d1 + (long)local_258;
    if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
      b = (secp256k1_gej *)0xffffffffffff;
      uVar14 = (long)(local_250->x).n + (uVar8 >> 0x34);
      uVar9 = (long)(local_278->x).n + (uVar14 >> 0x34);
      uVar10 = (long)(local_270->x).n + (uVar9 >> 0x34);
      uVar12 = (uVar10 >> 0x34) + (local_2a0 & 0xffffffffffff);
      if ((((uVar14 | uVar8 | uVar9 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
         (((uVar8 | 0x1000003d0) & uVar14 & uVar9 & uVar10 & (uVar12 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        uStack_2c0._0_4_ = 0x14d68c;
        uStack_2c0._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)local_188);
        uVar8 = ((ulong)local_288 >> 0x30) * 0x1000003d1 + (long)local_280;
        if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
          uVar14 = (long)(psVar13->x).n + (uVar8 >> 0x34);
          uVar9 = (long)(psVar11->x).n + (uVar14 >> 0x34);
          uVar10 = (uVar9 >> 0x34) + local_2a8;
          uVar12 = (uVar10 >> 0x34) + ((ulong)local_288 & 0xffffffffffff);
          if ((((uVar14 | uVar8 | uVar9 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
             (((uVar8 | 0x1000003d0) & uVar14 & uVar9 & uVar10 & (uVar12 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            uStack_2c0._0_4_ = 0x14d77e;
            uStack_2c0._4_4_ = 0;
            secp256k1_gej_double_var(local_2b0,local_290,local_298);
            return;
          }
        }
        if (local_298 != (secp256k1_fe *)0x0) {
          *(undefined1 (*) [16])((long)local_298->n + 0x1c) = (undefined1  [16])0x0;
          local_298->n[2] = 0;
          local_298->n[3] = 0;
          local_298->n[0] = 0;
          local_298->n[1] = 0;
          local_298->normalized = 1;
          uStack_2c0._0_4_ = 0x14d760;
          uStack_2c0._4_4_ = 0;
          secp256k1_fe_verify(local_298);
        }
        uStack_2c0._0_4_ = 0x14d76a;
        uStack_2c0._4_4_ = 0;
        secp256k1_gej_set_infinity(local_2b0);
        return;
      }
    }
    local_2b0->infinity = 0;
    uStack_2c0._0_4_ = 0x14d36c;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)local_248,(secp256k1_fe *)(local_188 + 0x30),local_268);
    if (local_298 != (secp256k1_fe *)0x0) {
      local_298->n[4] = local_248._32_8_;
      local_298->magnitude = local_248._40_4_;
      local_298->normalized = local_248._44_4_;
      local_298->n[2] = local_248._16_8_;
      local_298->n[3] = local_248._24_8_;
      local_298->n[0] = local_248._0_8_;
      local_298->n[1] = local_248._8_8_;
    }
    rzr = (secp256k1_fe *)local_248;
    uStack_2c0._0_4_ = 0x14d3ac;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul(&r->z,local_260,rzr);
    a = (secp256k1_gej *)&local_98;
    unaff_R12 = (secp256k1_gej *)(local_188 + 0x30);
    uStack_2c0._0_4_ = 0x14d3c7;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_sqr((secp256k1_fe *)a,(secp256k1_fe *)unaff_R12);
    uStack_2c0._0_4_ = 0x14d3cf;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a);
    uStack_2c0._0_4_ = 0x14d3dc;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_98 = 0x3ffffbfffff0bc - local_98;
    uStack_90 = 0x3ffffffffffffc - uStack_90;
    local_88 = 0x3ffffffffffffc - local_88;
    uStack_80 = 0x3ffffffffffffc - uStack_80;
    local_78 = 0x3fffffffffffc - local_78;
    local_70._0_4_ = 2;
    local_70._4_4_ = 0;
    uStack_2c0._0_4_ = 0x14d424;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)a);
    unaff_R13 = (secp256k1_gej *)(local_248 + 0x30);
    uStack_2c0._0_4_ = 0x14d43a;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R13,(secp256k1_fe *)a,(secp256k1_fe *)unaff_R12);
    uStack_2c0._0_4_ = 0x14d44d;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_mul(rzr,&local_128,(secp256k1_fe *)a);
    psVar11 = (secp256k1_gej *)local_188;
    uStack_2c0._0_4_ = 0x14d45d;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar11);
    uStack_2c0._0_4_ = 0x14d465;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_2c0._0_4_ = 0x14d46d;
    uStack_2c0._4_4_ = 0;
    psVar13 = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    iVar7 = local_1f0 + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014d79f;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._48_8_;
    (r->x).n[1] = uVar2 + uStack_210;
    (r->x).n[2] = uVar3 + local_208;
    (r->x).n[3] = uVar4 + uStack_200;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_1f8;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    uStack_2c0._0_4_ = 0x14d4bf;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_2c0._0_4_ = 0x14d4c7;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    rzr = (secp256k1_fe *)local_248;
    uStack_2c0._0_4_ = 0x14d4d4;
    uStack_2c0._4_4_ = 0;
    psVar13 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar7 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014d7a4;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_248;
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar2 + local_248._8_8_;
    (r->x).n[2] = uVar3 + local_248._16_8_;
    (r->x).n[3] = uVar4 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    uStack_2c0._0_4_ = 0x14d520;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_2c0._0_4_ = 0x14d528;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_2c0._0_4_ = 0x14d530;
    uStack_2c0._4_4_ = 0;
    psVar13 = (secp256k1_gej *)rzr;
    secp256k1_fe_verify(rzr);
    iVar7 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014d7a9;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    rzr = (secp256k1_fe *)local_248;
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar2 + local_248._8_8_;
    (r->x).n[2] = uVar3 + local_248._16_8_;
    (r->x).n[3] = uVar4 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    uStack_2c0._0_4_ = 0x14d57c;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(&r->x);
    uStack_2c0._0_4_ = 0x14d584;
    uStack_2c0._4_4_ = 0;
    secp256k1_fe_verify(rzr);
    uStack_2c0._0_4_ = 0x14d58c;
    uStack_2c0._4_4_ = 0;
    psVar13 = r;
    secp256k1_fe_verify(&r->x);
    iVar7 = (r->x).magnitude + local_248._40_4_;
    if (iVar7 < 0x21) {
      local_248._0_8_ = (r->x).n[0] + local_248._0_8_;
      local_248._8_8_ = (r->x).n[1] + local_248._8_8_;
      local_248._16_8_ = (r->x).n[2] + local_248._16_8_;
      local_248._24_8_ = (r->x).n[3] + local_248._24_8_;
      local_248._32_8_ = local_248._32_8_ + (r->x).n[4];
      local_248._44_4_ = 0;
      uStack_2c0._0_4_ = 0x14d5dc;
      uStack_2c0._4_4_ = 0;
      local_248._40_4_ = iVar7;
      secp256k1_fe_verify((secp256k1_fe *)local_248);
      rzr = &r->y;
      uStack_2c0._0_4_ = 0x14d5f3;
      uStack_2c0._4_4_ = 0;
      secp256k1_fe_mul(rzr,(secp256k1_fe *)local_248,(secp256k1_fe *)local_188);
      a = (secp256k1_gej *)(local_248 + 0x30);
      uStack_2c0._0_4_ = 0x14d60e;
      uStack_2c0._4_4_ = 0;
      psVar11 = a;
      secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,(secp256k1_fe *)local_1e8);
      uStack_2c0._0_4_ = 0x14d616;
      uStack_2c0._4_4_ = 0;
      secp256k1_fe_verify(rzr);
      uStack_2c0._0_4_ = 0x14d61e;
      uStack_2c0._4_4_ = 0;
      psVar13 = a;
      secp256k1_fe_verify((secp256k1_fe *)a);
      local_1f0 = local_1f0 + (r->y).magnitude;
      if (local_1f0 < 0x21) {
        uVar2 = (r->y).n[1];
        uVar3 = (r->y).n[2];
        uVar4 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_248._48_8_;
        (r->y).n[1] = uVar2 + uStack_210;
        (r->y).n[2] = uVar3 + local_208;
        (r->y).n[3] = uVar4 + uStack_200;
        puVar1 = (r->y).n + 4;
        *puVar1 = *puVar1 + local_1f8;
        (r->y).magnitude = local_1f0;
        (r->y).normalized = 0;
        uStack_2c0._0_4_ = 0x14d672;
        uStack_2c0._4_4_ = 0;
        secp256k1_fe_verify(rzr);
        uStack_2c0._0_4_ = 0x14d67a;
        uStack_2c0._4_4_ = 0;
        secp256k1_gej_verify(r);
        return;
      }
      goto LAB_0014d7b3;
    }
  }
  else {
    if (rzr == (secp256k1_fe *)0x0) {
LAB_0014cf49:
      memcpy(r,b,0x98);
      return;
    }
    uStack_2c0._0_4_ = 0x14d795;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_1();
LAB_0014d795:
    uStack_2c0._0_4_ = 0x14d79a;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_8();
LAB_0014d79a:
    uStack_2c0._0_4_ = 0x14d79f;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_7();
LAB_0014d79f:
    uStack_2c0._0_4_ = 0x14d7a4;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_6();
LAB_0014d7a4:
    uStack_2c0._0_4_ = 0x14d7a9;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_5();
LAB_0014d7a9:
    uStack_2c0._0_4_ = 0x14d7ae;
    uStack_2c0._4_4_ = 0;
    secp256k1_gej_add_var_cold_4();
  }
  uStack_2c0._0_4_ = 0x14d7b3;
  uStack_2c0._4_4_ = 0;
  secp256k1_gej_add_var_cold_3();
LAB_0014d7b3:
  uStack_2c0 = secp256k1_ge_set_all_gej_var;
  secp256k1_gej_add_var_cold_2();
  psVar16 = psVar11;
  lVar17 = extraout_RDX;
  psStack_320 = psVar13;
  auStack_318._48_8_ = r;
  auStack_318._56_8_ = unaff_R12;
  auStack_318._64_8_ = unaff_R13;
  auStack_318._72_8_ = rzr;
  auStack_318._80_8_ = a;
  uStack_2c0 = (code *)b;
  if (extraout_RDX != 0) {
    do {
      pcStack_328 = (code *)0x14d7e7;
      secp256k1_gej_verify(psVar16);
      lVar17 = lVar17 + -1;
      psVar16 = psVar16 + 1;
    } while (lVar17 != 0);
    psVar15 = &psVar11->z;
    lVar19 = -1;
    lVar17 = 0;
    psVar13 = psStack_320;
    do {
      if ((int)psVar15[1].n[0] == 0) {
        if (lVar19 == -1) {
          uVar4 = psVar15->n[0];
          uVar5 = psVar15->n[1];
          uVar2 = psVar15->n[2];
          uVar3 = psVar15->n[3];
          iVar7 = psVar15->magnitude;
          iVar6 = psVar15->normalized;
          (psVar13->x).n[4] = psVar15->n[4];
          (psVar13->x).magnitude = iVar7;
          (psVar13->x).normalized = iVar6;
          (psVar13->x).n[2] = uVar2;
          (psVar13->x).n[3] = uVar3;
          (psVar13->x).n[0] = uVar4;
          (psVar13->x).n[1] = uVar5;
          lVar19 = lVar17;
        }
        else {
          pcStack_328 = (code *)0x14d82f;
          secp256k1_fe_mul(&psVar13->x,(secp256k1_fe *)((long)&psStack_320->x + lVar19 * 0x68),
                           psVar15);
          lVar19 = lVar17;
        }
      }
      else {
        pcStack_328 = (code *)0x14d814;
        secp256k1_ge_set_infinity((secp256k1_ge *)psVar13);
      }
      psVar16 = psStack_320;
      lVar17 = lVar17 + 1;
      psVar13 = (secp256k1_gej *)((psVar13->z).n + 1);
      psVar15 = (secp256k1_fe *)(psVar15[3].n + 1);
    } while (extraout_RDX != lVar17);
    if (lVar19 != -1) {
      x = (secp256k1_ge *)((long)&psStack_320->x + lVar19 * 0x68);
      a_01 = (secp256k1_ge *)auStack_318;
      pcStack_328 = (code *)0x14d887;
      secp256k1_fe_inv_var((secp256k1_fe *)a_01,(secp256k1_fe *)x);
      if (lVar19 == 0) {
        lVar19 = 0;
      }
      else {
        lVar17 = lVar19 + -1;
        piVar18 = &psVar11[lVar19 + -1].infinity;
        psVar15 = (secp256k1_fe *)((long)&psVar16->x + lVar19 * 0x68);
        do {
          psVar15 = (secp256k1_fe *)((long)(psVar15 + 0xfffffffffffffffd) + 0x28);
          if (*piVar18 == 0) {
            pcStack_328 = (code *)0x14d8c5;
            secp256k1_fe_mul((secp256k1_fe *)((long)&psStack_320->x + lVar19 * 0x68),psVar15,
                             (secp256k1_fe *)auStack_318);
            x = (secp256k1_ge *)auStack_318;
            pcStack_328 = (code *)0x14d8e1;
            a_01 = x;
            secp256k1_fe_mul((secp256k1_fe *)x,(secp256k1_fe *)x,&psVar11[lVar19].z);
            lVar19 = lVar17;
          }
          piVar18 = piVar18 + -0x26;
          bVar20 = lVar17 != 0;
          lVar17 = lVar17 + -1;
        } while (bVar20);
      }
      psVar13 = psStack_320;
      if (psVar11[lVar19].infinity != 0) {
        pcStack_328 = secp256k1_ge_from_bytes_ext;
        secp256k1_ge_set_all_gej_var_cold_1();
        sStack_368.y.n[2] = 0;
        do {
          if (*(char *)((long)(x->x).n + sStack_368.y.n[2]) != '\0') {
            sStack_368.x.n[0] = (x->x).n[0];
            sStack_368.x.n[1] = (x->x).n[1];
            sStack_368.x.n[2] = (x->x).n[2];
            sStack_368.x.n[3] = (x->x).n[3];
            sStack_368.y.n[0] = (x->x).n[4];
            sStack_368.y.n[1]._0_4_ = (x->x).magnitude;
            sStack_368.y.n[1]._4_4_ = (x->x).normalized;
            sStack_368.y.n[2] = (x->y).n[0];
            sStack_368.y.n[3] = (x->y).n[1];
            secp256k1_ge_from_storage(a_01,&sStack_368);
            return;
          }
          sStack_368.y.n[2] = sStack_368.y.n[2] + 1;
        } while (sStack_368.y.n[2] != 0x40);
        a_01->infinity = 1;
        (a_01->x).n[0] = 0;
        (a_01->x).n[1] = 0;
        (a_01->x).n[2] = 0;
        (a_01->x).n[3] = 0;
        *(undefined8 *)((long)(a_01->x).n + 0x1c) = 0;
        *(undefined8 *)((long)(a_01->x).n + 0x24) = 0;
        (a_01->x).normalized = 1;
        sStack_368.y.n[1] = 0x148364;
        pcStack_328 = (code *)lVar17;
        secp256k1_fe_verify(&a_01->x);
        *(undefined8 *)((long)(a_01->y).n + 0x1c) = 0;
        *(undefined8 *)((long)(a_01->y).n + 0x24) = 0;
        (a_01->y).n[2] = 0;
        (a_01->y).n[3] = 0;
        (a_01->y).n[0] = 0;
        (a_01->y).n[1] = 0;
        (a_01->y).normalized = 1;
        sStack_368.y.n[1] = 0x14837f;
        secp256k1_fe_verify(&a_01->y);
        secp256k1_ge_verify(a_01);
        return;
      }
      lVar19 = lVar19 * 0x68;
      puVar1 = (uint64_t *)((long)&psStack_320->y + lVar19 + -0x10);
      *puVar1 = auStack_318._32_8_;
      puVar1[1] = auStack_318._40_8_;
      puVar1 = (uint64_t *)((long)&psStack_320->x + lVar19 + 0x10);
      *puVar1 = auStack_318._16_8_;
      puVar1[1] = auStack_318._24_8_;
      puVar1 = (uint64_t *)((long)&psStack_320->x + lVar19);
      *puVar1 = auStack_318._0_8_;
      puVar1[1] = auStack_318._8_8_;
      psVar16 = psStack_320;
      lVar17 = extraout_RDX;
      if (extraout_RDX != 0) {
        do {
          if (psVar11->infinity == 0) {
            pcStack_328 = (code *)0x14d957;
            secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar16,psVar11,&psVar16->x);
          }
          psVar11 = psVar11 + 1;
          lVar17 = lVar17 + -1;
          lVar19 = extraout_RDX;
          psVar16 = (secp256k1_gej *)((psVar16->z).n + 1);
        } while (lVar17 != 0);
        do {
          pcStack_328 = (code *)0x14d96f;
          secp256k1_ge_verify((secp256k1_ge *)psVar13);
          psVar13 = (secp256k1_gej *)((psVar13->z).n + 1);
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}